

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int serial_open(int pi,char *dev,uint baud,uint flags)

{
  int iVar1;
  size_t sVar2;
  gpioExtent_t *in_RSI;
  gpioExtent_t ext [1];
  int len;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_fffffffffffffff8;
  
  sVar2 = strlen((char *)in_RSI);
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                             (int)sVar2 >> 0x1f,in_RSI,in_stack_fffffffffffffff8);
  return iVar1;
}

Assistant:

int serial_open(int pi, char *dev, unsigned baud, unsigned flags)
{
   int len;
   gpioExtent_t ext[1];

   len = strlen(dev);

   /*
   p1=baud
   p2=flags
   p3=len
   ## extension ##
   char dev[len]
   */

   ext[0].size = len;
   ext[0].ptr = dev;

   return pigpio_command_ext
      (pi, PI_CMD_SERO, baud, flags, len, 1, ext, 1);
}